

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_long>::test_random_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_long> *this,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)0> *the_divider)

{
  unsigned_long numer;
  long lVar1;
  size_t i;
  long lVar2;
  
  for (lVar2 = 0; lVar1 = 8, lVar2 != 10000; lVar2 = lVar2 + 1) {
    while (lVar1 != 0) {
      numer = get_random(this);
      test_one<(libdivide::Branching)0>(this,numer,denom,the_divider);
      lVar1 = lVar1 + -1;
    }
  }
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }